

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeUni * __thiscall Parser::CreateUniNode(Parser *this,OpCode nop,ParseNodePtr pnode1)

{
  Scanner_t *pSVar1;
  ParseNodeUni *pPVar2;
  charcount_t local_28;
  charcount_t local_24;
  charcount_t ichLim;
  charcount_t ichMin;
  ParseNodePtr pnode1_local;
  OpCode nop_local;
  Parser *this_local;
  
  if (pnode1 == (ParseNodePtr)0x0) {
    pSVar1 = GetScanner(this);
    local_24 = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(pSVar1);
    pSVar1 = GetScanner(this);
    local_28 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(pSVar1);
  }
  else {
    local_24 = pnode1->ichMin;
    local_28 = pnode1->ichLim;
    CheckArguments(this,pnode1);
  }
  pPVar2 = CreateUniNode(this,nop,pnode1,local_24,local_28);
  return pPVar2;
}

Assistant:

ParseNodeUni * Parser::CreateUniNode(OpCode nop, ParseNodePtr pnode1)
{
    charcount_t ichMin;
    charcount_t ichLim;

    if (nullptr == pnode1)
    {
        // no ops
        ichMin = this->GetScanner()->IchMinTok();
        ichLim = this->GetScanner()->IchLimTok();
    }
    else
    {
        // 1 op
        ichMin = pnode1->ichMin;
        ichLim = pnode1->ichLim;
        this->CheckArguments(pnode1);
    }
    return CreateUniNode(nop, pnode1, ichMin, ichLim);
}